

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepairResponsePdu.cpp
# Opt level: O0

void __thiscall DIS::RepairResponsePdu::marshal(RepairResponsePdu *this,DataStream *dataStream)

{
  DataStream *dataStream_local;
  RepairResponsePdu *this_local;
  
  LogisticsFamilyPdu::marshal(&this->super_LogisticsFamilyPdu,dataStream);
  EntityID::marshal(&this->_receivingEntityID,dataStream);
  EntityID::marshal(&this->_repairingEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_repairResult);
  DataStream::operator<<(dataStream,this->_padding1);
  DataStream::operator<<(dataStream,this->_padding2);
  return;
}

Assistant:

void RepairResponsePdu::marshal(DataStream& dataStream) const
{
    LogisticsFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _receivingEntityID.marshal(dataStream);
    _repairingEntityID.marshal(dataStream);
    dataStream << _repairResult;
    dataStream << _padding1;
    dataStream << _padding2;
}